

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

void slang::ast::packBitstream(ConstantValue *value,SmallVectorBase<slang::ConstantValue_*> *packed)

{
  bool bVar1;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> *this;
  ConstantValue *in_RSI;
  ConstantValue *cv_1;
  iterator __end7;
  iterator __begin7;
  SVQueue *__range7;
  pair<const_slang::ConstantValue,_slang::ConstantValue> *kv;
  iterator __end6;
  iterator __begin6;
  AssociativeArray *__range6;
  ConstantValue *cv;
  iterator __end5;
  iterator __begin5;
  span<slang::ConstantValue,_18446744073709551615UL> *__range5;
  span<slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff38;
  SmallVectorBase<slang::ConstantValue_*> *in_stack_ffffffffffffff40;
  span<slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff48;
  _Self local_98;
  SVQueue *local_78;
  reference local_70;
  _Self local_68;
  _Self local_60;
  AssociativeArray *local_58;
  reference local_50;
  ConstantValue *local_48;
  __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
  local_40;
  span<slang::ConstantValue,_18446744073709551615UL> local_38;
  span<slang::ConstantValue,_18446744073709551615UL> *local_28;
  SmallVectorBase<slang::ConstantValue_*> *in_stack_ffffffffffffffe8;
  
  bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa1bc34);
  if (bVar1) {
    SmallVectorBase<slang::ConstantValue_*>::push_back
              (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->_M_ptr);
  }
  else {
    bVar1 = slang::ConstantValue::isString((ConstantValue *)0xa1bc71);
    if (bVar1) {
      slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0xa1bc84);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xa1bc8c);
      if (!bVar1) {
        SmallVectorBase<slang::ConstantValue_*>::push_back
                  (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->_M_ptr);
      }
    }
    else {
      bVar1 = slang::ConstantValue::isUnpacked((ConstantValue *)0xa1bcc7);
      if (bVar1) {
        local_38 = slang::ConstantValue::elements((ConstantValue *)0xa1bcdd);
        local_28 = &local_38;
        local_40._M_current =
             (ConstantValue *)
             std::span<slang::ConstantValue,_18446744073709551615UL>::begin
                       (in_stack_ffffffffffffff38);
        local_48 = (ConstantValue *)
                   std::span<slang::ConstantValue,_18446744073709551615UL>::end
                             (in_stack_ffffffffffffff48);
        while (bVar1 = __gnu_cxx::
                       operator==<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
                                 ((__normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff40,
                                  (__normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_50 = __gnu_cxx::
                     __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
                     ::operator*(&local_40);
          packBitstream(in_RSI,in_stack_ffffffffffffffe8);
          __gnu_cxx::
          __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
          ::operator++(&local_40);
        }
      }
      else {
        bVar1 = slang::ConstantValue::isMap((ConstantValue *)0xa1bd89);
        if (bVar1) {
          slang::ConstantValue::map((ConstantValue *)0xa1bd9f);
          local_58 = CopyPtr<slang::AssociativeArray>::operator*
                               ((CopyPtr<slang::AssociativeArray> *)0xa1bda7);
          local_60._M_node =
               (_Base_ptr)
               std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::begin((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                        *)in_stack_ffffffffffffff38);
          local_68._M_node =
               (_Base_ptr)
               std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::end((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                      *)in_stack_ffffffffffffff38);
          while (bVar1 = std::operator==(&local_60,&local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_70 = std::
                       _Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                       ::operator*((_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                                    *)0xa1bdeb);
            packBitstream(in_RSI,in_stack_ffffffffffffffe8);
            std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
            operator++((_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                        *)in_stack_ffffffffffffff40);
          }
        }
        else {
          bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0xa1be24);
          if (bVar1) {
            slang::ConstantValue::queue((ConstantValue *)0xa1be37);
            local_78 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0xa1be3f);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_ffffffffffffff38);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_ffffffffffffff38);
            while (bVar1 = std::operator==(&local_98,(_Self *)&stack0xffffffffffffff48),
                  ((bVar1 ^ 0xffU) & 1) != 0) {
              this = (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                      *)std::
                        _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                        ::operator*(&local_98);
              packBitstream(in_RSI,in_stack_ffffffffffffffe8);
              std::
              _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
              ::operator++(this);
            }
          }
          else {
            bVar1 = slang::ConstantValue::isUnion((ConstantValue *)0xa1beb5);
            if (bVar1) {
              slang::ConstantValue::unionVal((ConstantValue *)0xa1bec8);
              CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xa1bed0);
              packBitstream(in_RSI,in_stack_ffffffffffffffe8);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void packBitstream(ConstantValue& value, SmallVectorBase<ConstantValue*>& packed) {
    if (value.isInteger()) {
        packed.push_back(&value);
    }
    else if (value.isString()) {
        if (!value.str().empty())
            packed.push_back(&value);
    }
    else if (value.isUnpacked()) {
        for (auto& cv : value.elements())
            packBitstream(cv, packed);
    }
    else if (value.isMap()) {
        for (auto& kv : *value.map()) {
            packBitstream(kv.second, packed);
        }
    }
    else if (value.isQueue()) {
        for (auto& cv : *value.queue())
            packBitstream(cv, packed);
    }
    else if (value.isUnion()) {
        packBitstream(value.unionVal()->value, packed);
    }
}